

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O2

Vec_Int_t * Supp_ManTransferEntry(Supp_One_t *p)

{
  Vec_Int_t *p_00;
  long lVar1;
  
  p_00 = Vec_IntAlloc(p->nOuts);
  for (lVar1 = 0; lVar1 < p->nOuts; lVar1 = lVar1 + 1) {
    Vec_IntPush(p_00,(&p[1].nRefs)[lVar1]);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Supp_ManTransferEntry( Supp_One_t * p )
{
    Vec_Int_t * vSupp;
    int i;
    vSupp = Vec_IntAlloc( p->nOuts );
    for ( i = 0; i < p->nOuts; i++ )
        Vec_IntPush( vSupp, p->pOuts[i] );
    return vSupp;
}